

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxCompareEq::Resolve(FxCompareEq *this,FCompileContext *ctx)

{
  BYTE BVar1;
  PPointer *dest;
  PPointer *source;
  PInt *pPVar2;
  PString *pPVar3;
  anon_union_8_3_addc324a_for_ExpVal_1 aVar4;
  PClass *pPVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  FxExpression *pFVar8;
  PClass *pPVar9;
  undefined4 extraout_var_02;
  FxTypeCast *pFVar10;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  FxExpression *pFVar11;
  long *plVar12;
  char *pcVar13;
  char *pcVar14;
  undefined4 uVar15;
  FScriptPosition *pFVar16;
  PType *pPVar17;
  undefined4 uVar18;
  anon_union_8_3_addc324a_for_ExpVal_1 aVar19;
  PType *pPVar20;
  bool bVar21;
  FString v1;
  FString v2;
  anon_union_8_3_addc324a_for_ExpVal_1 local_60;
  anon_union_8_3_addc324a_for_ExpVal_1 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  anon_union_8_3_addc324a_for_ExpVal_1 local_38;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  if ((this->super_FxBinary).super_FxExpression.isresolved != false) {
    return (FxExpression *)this;
  }
  (this->super_FxBinary).super_FxExpression.isresolved = true;
  pFVar11 = (this->super_FxBinary).left;
  if (pFVar11 != (FxExpression *)0x0) {
    iVar6 = (*pFVar11->_vptr_FxExpression[2])(pFVar11,ctx);
    (this->super_FxBinary).left = (FxExpression *)CONCAT44(extraout_var,iVar6);
  }
  pFVar11 = (this->super_FxBinary).right;
  if (pFVar11 == (FxExpression *)0x0) goto LAB_00527da9;
  aVar19.pointer = &(this->super_FxBinary).right;
  iVar6 = (*pFVar11->_vptr_FxExpression[2])(pFVar11,ctx);
  pFVar8 = (FxExpression *)CONCAT44(extraout_var_00,iVar6);
  (this->super_FxBinary).right = pFVar8;
  pPVar5 = PClassPointer::RegistrationInfo.MyClass;
  pFVar11 = (this->super_FxBinary).left;
  if ((pFVar11 == (FxExpression *)0x0) || (pFVar8 == (FxExpression *)0x0)) goto LAB_00527da9;
  pPVar17 = pFVar11->ValueType;
  pPVar20 = pFVar8->ValueType;
  if (pPVar17 == pPVar20) {
    (this->super_FxBinary).super_FxExpression.ValueType = pPVar17;
LAB_00527baa:
    if (((this->super_FxBinary).Operator != 0x121) ||
       (((this->super_FxBinary).super_FxExpression.ValueType)->RegType - 1 < 2)) {
      iVar6 = (*((this->super_FxBinary).left)->_vptr_FxExpression[3])();
      if (((char)iVar6 != '\0') &&
         (iVar6 = (*(*aVar19.pointer)->_vptr_FxExpression[3])(), (char)iVar6 != '\0')) {
        pPVar17 = (this->super_FxBinary).super_FxExpression.ValueType;
        if (pPVar17 == (PType *)TypeString) {
          pFVar11 = (this->super_FxBinary).left;
          pPVar20 = (PType *)pFVar11[1]._vptr_FxExpression;
          pFVar16 = &pFVar11[1].ScriptPosition;
          if (pPVar20 == pPVar17) {
            FString::AttachToOther((FString *)&local_60,&pFVar16->FileName);
          }
          else {
            local_60 = (anon_union_8_3_addc324a_for_ExpVal_1)(pFVar16->FileName).Chars;
          }
          ExpVal::GetString((ExpVal *)local_48);
          if (pPVar20 == (PType *)TypeString) {
            FString::~FString((FString *)&local_60);
          }
          pPVar3 = (PString *)(*aVar19.pointer)[1]._vptr_FxExpression;
          pFVar16 = &(*aVar19.pointer)[1].ScriptPosition;
          if (pPVar3 == TypeString) {
            FString::AttachToOther((FString *)&local_60,&pFVar16->FileName);
          }
          else {
            local_60 = (anon_union_8_3_addc324a_for_ExpVal_1)(pFVar16->FileName).Chars;
          }
          ExpVal::GetString((ExpVal *)(local_48 + 8));
          if (pPVar3 == TypeString) {
            FString::~FString((FString *)&local_60);
          }
          iVar6 = (this->super_FxBinary).Operator;
          if (iVar6 == 0x121) {
            iVar6 = strcasecmp((char *)local_48._0_8_,(char *)local_48._8_8_);
            bVar21 = iVar6 == 0;
          }
          else {
            iVar7 = strcmp((char *)local_48._0_8_,(char *)local_48._8_8_);
            bVar21 = (iVar6 == 0x11f) != (iVar7 != 0);
          }
          FString::~FString((FString *)(local_48 + 8));
          FString::~FString((FString *)local_48);
        }
        else if (pPVar17->RegType == '\x01') {
          pFVar11 = (this->super_FxBinary).left;
          pPVar2 = (PInt *)pFVar11[1]._vptr_FxExpression;
          pFVar16 = &pFVar11[1].ScriptPosition;
          if (pPVar2 == (PInt *)TypeString) {
            FString::AttachToOther((FString *)&local_60,&pFVar16->FileName);
          }
          else {
            local_60 = (anon_union_8_3_addc324a_for_ExpVal_1)(pFVar16->FileName).Chars;
          }
          local_58 = local_60;
          if ((pPVar2->field_0x6b != '\x01') && (local_58.Float = 0.0, pPVar2->field_0x6b == '\0'))
          {
            if (pPVar2 == TypeUInt32) {
              local_58.Float = (double)((ulong)local_60.pointer & 0xffffffff);
            }
            else {
              local_58.Float = (double)local_60.Int;
            }
          }
          uStack_50 = 0;
          if (pPVar2 == (PInt *)TypeString) {
            FString::~FString((FString *)&local_60);
          }
          pPVar2 = (PInt *)(*aVar19.pointer)[1]._vptr_FxExpression;
          pFVar16 = &(*aVar19.pointer)[1].ScriptPosition;
          if (pPVar2 == (PInt *)TypeString) {
            FString::AttachToOther((FString *)&local_60,&pFVar16->FileName);
          }
          else {
            local_60 = (anon_union_8_3_addc324a_for_ExpVal_1)(pFVar16->FileName).Chars;
          }
          aVar19 = local_60;
          if ((pPVar2->field_0x6b != '\x01') && (aVar19.Float = 0.0, pPVar2->field_0x6b == '\0')) {
            if (pPVar2 == TypeUInt32) {
              aVar19.Float = (double)((ulong)local_60.pointer & 0xffffffff);
            }
            else {
              aVar19.Float = (double)local_60.Int;
            }
          }
          if (pPVar2 == (PInt *)TypeString) {
            local_38 = aVar19;
            FString::~FString((FString *)&local_60);
            aVar19 = local_38;
          }
          iVar6 = (this->super_FxBinary).Operator;
          if (iVar6 == 0x120) {
            bVar21 = local_58.Float != aVar19.Float;
          }
          else {
            if (iVar6 != 0x11f) {
              bVar21 = ABS(local_58.Float - aVar19.Float) < 1.52587890625e-05;
              goto LAB_00528392;
            }
            bVar21 = local_58.Float == aVar19.Float;
          }
          bVar21 = (bool)(-bVar21 & 1);
        }
        else {
          pFVar11 = (this->super_FxBinary).left;
          pPVar3 = (PString *)pFVar11[1]._vptr_FxExpression;
          pFVar16 = &pFVar11[1].ScriptPosition;
          if (pPVar3 == TypeString) {
            FString::AttachToOther((FString *)&local_60,&pFVar16->FileName);
          }
          else {
            local_60 = (anon_union_8_3_addc324a_for_ExpVal_1)(pFVar16->FileName).Chars;
          }
          BVar1 = (pPVar3->super_PBasicType).super_PType.RegType;
          if (BVar1 == '\x01') {
            uVar15 = (undefined4)local_60.Float;
          }
          else {
            uVar15 = 0;
            if (BVar1 == '\0') {
              uVar15 = local_60.Int;
            }
          }
          if (pPVar3 == TypeString) {
            FString::~FString((FString *)&local_60);
          }
          pPVar3 = (PString *)(*aVar19.pointer)[1]._vptr_FxExpression;
          pFVar16 = &(*aVar19.pointer)[1].ScriptPosition;
          if (pPVar3 == TypeString) {
            FString::AttachToOther((FString *)&local_60,&pFVar16->FileName);
          }
          else {
            local_60 = (anon_union_8_3_addc324a_for_ExpVal_1)(pFVar16->FileName).Chars;
          }
          BVar1 = (pPVar3->super_PBasicType).super_PType.RegType;
          if (BVar1 == '\x01') {
            uVar18 = (undefined4)local_60.Float;
          }
          else {
            uVar18 = 0;
            if (BVar1 == '\0') {
              uVar18 = local_60.Int;
            }
          }
          if (pPVar3 == TypeString) {
            FString::~FString((FString *)&local_60);
          }
          bVar21 = (uVar15 != uVar18) != ((this->super_FxBinary).Operator == 0x11f);
        }
LAB_00528392:
        pFVar11 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x38);
        pFVar11->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
        FScriptPosition::FScriptPosition
                  (&pFVar11->ScriptPosition,
                   &(this->super_FxBinary).super_FxExpression.ScriptPosition);
        pFVar11->NeedResult = true;
        pFVar11->ExprType = EFX_Constant;
        pFVar11->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0070d3e8;
        pPVar2 = TypeSInt32;
        pFVar11[1]._vptr_FxExpression = (_func_int **)TypeSInt32;
        pFVar11->ValueType = (PType *)pPVar2;
        *(uint *)&pFVar11[1].ScriptPosition.FileName.Chars = (uint)bVar21;
        pFVar11->isresolved = true;
        (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])(this);
        return pFVar11;
      }
      if ((this->super_FxBinary).Operator == 0x121) goto LAB_00528276;
      iVar6 = (*((this->super_FxBinary).left)->_vptr_FxExpression[3])();
      if ((char)iVar6 != '\0') {
        pFVar11 = (this->super_FxBinary).left;
        BVar1 = pFVar11->ValueType->RegType;
        if (BVar1 == '\x03') {
          pPVar3 = (PString *)pFVar11[1]._vptr_FxExpression;
          if (pPVar3 == TypeString) {
            FString::AttachToOther((FString *)&local_60,&pFVar11[1].ScriptPosition.FileName);
          }
          else {
            local_60 = (anon_union_8_3_addc324a_for_ExpVal_1)
                       pFVar11[1].ScriptPosition.FileName.Chars;
          }
          BVar1 = (pPVar3->super_PBasicType).super_PType.RegType;
          bVar21 = (FxExpression **)local_60.pointer == (FxExpression **)0x0;
          if (pPVar3 == TypeString) {
            FString::~FString((FString *)&local_60);
          }
          if (bVar21 || BVar1 != '\x03') {
LAB_0052843c:
            if ((this->super_FxBinary).Operator == 0x11f) {
              plVar12 = (long *)FMemArena::Alloc(&FxAlloc,0x30);
              pFVar11 = *aVar19.pointer;
              *plVar12 = (long)&PTR__FxExpression_0070d370;
              FScriptPosition::FScriptPosition
                        ((FScriptPosition *)(plVar12 + 1),&pFVar11->ScriptPosition);
              plVar12[3] = 0;
              *(undefined2 *)(plVar12 + 4) = 0x100;
              *(undefined4 *)((long)plVar12 + 0x24) = 0x10;
              *plVar12 = (long)&PTR__FxUnaryNotBoolean_0070b9c0;
              plVar12[5] = (long)pFVar11;
            }
            else {
              plVar12 = (long *)FMemArena::Alloc(&FxAlloc,0x38);
              pFVar11 = *aVar19.pointer;
              *plVar12 = (long)&PTR__FxExpression_0070d370;
              FScriptPosition::FScriptPosition
                        ((FScriptPosition *)(plVar12 + 1),&pFVar11->ScriptPosition);
              *(undefined2 *)(plVar12 + 4) = 0x100;
              *(undefined4 *)((long)plVar12 + 0x24) = 5;
              *plVar12 = (long)&PTR__FxBoolCast_0070b548;
              plVar12[5] = (long)pFVar11;
              plVar12[3] = (long)TypeBool;
              *(undefined1 *)(plVar12 + 6) = 1;
            }
            (this->super_FxBinary).right = (FxExpression *)0x0;
            goto LAB_00528609;
          }
        }
        else if (BVar1 == '\x01') {
          if (pFVar11->ValueType->RegCount != '\x01') {
            __assert_fail("left->ValueType->GetRegCount() == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                          ,0xd83,"virtual FxExpression *FxCompareEq::Resolve(FCompileContext &)");
          }
          pPVar2 = (PInt *)pFVar11[1]._vptr_FxExpression;
          if (pPVar2 == (PInt *)TypeString) {
            FString::AttachToOther((FString *)&local_60,&pFVar11[1].ScriptPosition.FileName);
          }
          else {
            local_60 = (anon_union_8_3_addc324a_for_ExpVal_1)
                       pFVar11[1].ScriptPosition.FileName.Chars;
          }
          aVar4 = local_60;
          if ((pPVar2->field_0x6b != '\x01') && (aVar4.Float = 0.0, pPVar2->field_0x6b == '\0')) {
            if (pPVar2 == TypeUInt32) {
              aVar4.Float = (double)((ulong)local_60.pointer & 0xffffffff);
            }
            else {
              aVar4.Float = (double)local_60.Int;
            }
          }
          if (pPVar2 == (PInt *)TypeString) {
            local_58 = aVar4;
            FString::~FString((FString *)&local_60);
            aVar4 = local_58;
          }
          if ((aVar4.Float == 0.0) && (!NAN(aVar4.Float))) goto LAB_0052843c;
        }
        else if (BVar1 == '\0') {
          pPVar3 = (PString *)pFVar11[1]._vptr_FxExpression;
          if (pPVar3 == TypeString) {
            FString::AttachToOther((FString *)&local_60,&pFVar11[1].ScriptPosition.FileName);
          }
          else {
            local_60 = (anon_union_8_3_addc324a_for_ExpVal_1)
                       pFVar11[1].ScriptPosition.FileName.Chars;
          }
          BVar1 = (pPVar3->super_PBasicType).super_PType.RegType;
          if (BVar1 == '\x01') {
            uVar15 = (undefined4)local_60.Float;
          }
          else {
            uVar15 = 0;
            if (BVar1 == '\0') {
              uVar15 = local_60.Int;
            }
          }
          if (pPVar3 == TypeString) {
            FString::~FString((FString *)&local_60);
          }
          if (uVar15 == 0) goto LAB_0052843c;
        }
      }
      iVar6 = (*(*aVar19.pointer)->_vptr_FxExpression[3])();
      if ((char)iVar6 == '\0') goto LAB_00528276;
      pFVar11 = *aVar19.pointer;
      BVar1 = pFVar11->ValueType->RegType;
      if (BVar1 == '\x03') {
        pPVar3 = (PString *)pFVar11[1]._vptr_FxExpression;
        if (pPVar3 == TypeString) {
          FString::AttachToOther((FString *)&local_60,&pFVar11[1].ScriptPosition.FileName);
        }
        else {
          local_60 = (anon_union_8_3_addc324a_for_ExpVal_1)pFVar11[1].ScriptPosition.FileName.Chars;
        }
        BVar1 = (pPVar3->super_PBasicType).super_PType.RegType;
        bVar21 = (FxExpression **)local_60.pointer != (FxExpression **)0x0;
        if (pPVar3 == TypeString) {
          FString::~FString((FString *)&local_60);
        }
        if (bVar21 && BVar1 == '\x03') goto LAB_00528276;
      }
      else if (BVar1 == '\x01') {
        if (pFVar11->ValueType->RegCount != '\x01') {
          __assert_fail("right->ValueType->GetRegCount() == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                        ,0xda3,"virtual FxExpression *FxCompareEq::Resolve(FCompileContext &)");
        }
        pPVar2 = (PInt *)pFVar11[1]._vptr_FxExpression;
        if (pPVar2 == (PInt *)TypeString) {
          FString::AttachToOther((FString *)&local_60,&pFVar11[1].ScriptPosition.FileName);
        }
        else {
          local_60 = (anon_union_8_3_addc324a_for_ExpVal_1)pFVar11[1].ScriptPosition.FileName.Chars;
        }
        aVar19 = local_60;
        if ((pPVar2->field_0x6b != '\x01') && (aVar19.Float = 0.0, pPVar2->field_0x6b == '\0')) {
          if (pPVar2 == TypeUInt32) {
            aVar19.Float = (double)((ulong)local_60.pointer & 0xffffffff);
          }
          else {
            aVar19.Float = (double)local_60.Int;
          }
        }
        if (pPVar2 == (PInt *)TypeString) {
          local_58 = aVar19;
          FString::~FString((FString *)&local_60);
          aVar19 = local_58;
        }
        if ((aVar19.Float != 0.0) || (NAN(aVar19.Float))) goto LAB_00528276;
      }
      else {
        if (BVar1 != '\0') {
LAB_00528276:
          (this->super_FxBinary).super_FxExpression.ValueType = (PType *)TypeBool;
          return (FxExpression *)this;
        }
        pPVar3 = (PString *)pFVar11[1]._vptr_FxExpression;
        if (pPVar3 == TypeString) {
          FString::AttachToOther((FString *)&local_60,&pFVar11[1].ScriptPosition.FileName);
        }
        else {
          local_60 = (anon_union_8_3_addc324a_for_ExpVal_1)pFVar11[1].ScriptPosition.FileName.Chars;
        }
        BVar1 = (pPVar3->super_PBasicType).super_PType.RegType;
        if (BVar1 == '\x01') {
          uVar15 = (undefined4)local_60.Float;
        }
        else {
          uVar15 = 0;
          if (BVar1 == '\0') {
            uVar15 = local_60.Int;
          }
        }
        if (pPVar3 == TypeString) {
          FString::~FString((FString *)&local_60);
        }
        if (uVar15 != 0) goto LAB_00528276;
      }
      if ((this->super_FxBinary).Operator == 0x11f) {
        plVar12 = (long *)FMemArena::Alloc(&FxAlloc,0x30);
        pFVar11 = (this->super_FxBinary).left;
        *plVar12 = (long)&PTR__FxExpression_0070d370;
        FScriptPosition::FScriptPosition((FScriptPosition *)(plVar12 + 1),&pFVar11->ScriptPosition);
        plVar12[3] = 0;
        *(undefined2 *)(plVar12 + 4) = 0x100;
        *(undefined4 *)((long)plVar12 + 0x24) = 0x10;
        *plVar12 = (long)&PTR__FxUnaryNotBoolean_0070b9c0;
        plVar12[5] = (long)pFVar11;
      }
      else {
        plVar12 = (long *)FMemArena::Alloc(&FxAlloc,0x38);
        pFVar11 = (this->super_FxBinary).left;
        *plVar12 = (long)&PTR__FxExpression_0070d370;
        FScriptPosition::FScriptPosition((FScriptPosition *)(plVar12 + 1),&pFVar11->ScriptPosition);
        *(undefined2 *)(plVar12 + 4) = 0x100;
        *(undefined4 *)((long)plVar12 + 0x24) = 5;
        *plVar12 = (long)&PTR__FxBoolCast_0070b548;
        plVar12[5] = (long)pFVar11;
        plVar12[3] = (long)TypeBool;
        *(undefined1 *)(plVar12 + 6) = 1;
      }
      (this->super_FxBinary).left = (FxExpression *)0x0;
LAB_00528609:
      (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])(this);
      pFVar11 = (FxExpression *)(**(code **)(*plVar12 + 0x10))(plVar12,ctx);
      return pFVar11;
    }
  }
  else {
    if (pPVar17 == (PType *)TypeName || pPVar17 == (PType *)TypeString) {
      if (((pPVar20 != (PType *)TypeName) && (pPVar20 != (PType *)TypeSound)) &&
         (pPVar20 != (PType *)TypeColor)) {
        pPVar9 = (((PBasicType *)&pPVar20->super_PTypeBase)->super_PType).super_PTypeBase.
                 super_DObject.Class;
        local_58 = aVar19;
        if (pPVar9 == (PClass *)0x0) {
          iVar6 = (**(((PBasicType *)&pPVar20->super_PTypeBase)->super_PType).super_PTypeBase.
                     super_DObject._vptr_DObject)(pPVar20);
          pPVar9 = (PClass *)CONCAT44(extraout_var_01,iVar6);
          (((PBasicType *)&pPVar20->super_PTypeBase)->super_PType).super_PTypeBase.super_DObject.
          Class = pPVar9;
        }
        bVar21 = pPVar9 != (PClass *)0x0;
        if (pPVar9 != pPVar5 && bVar21) {
          do {
            pPVar9 = pPVar9->ParentClass;
            bVar21 = pPVar9 != (PClass *)0x0;
            if (pPVar9 == pPVar5) break;
          } while (pPVar9 != (PClass *)0x0);
        }
        aVar19 = local_58;
        if ((!bVar21) &&
           (pPVar20 = (*local_58.pointer)->ValueType, pPVar20 != (PType *)TypeStateLabel)) {
          pFVar11 = (this->super_FxBinary).left;
          goto LAB_005279bc;
        }
      }
      pFVar10 = (FxTypeCast *)FMemArena::Alloc(&FxAlloc,0x38);
      FxTypeCast::FxTypeCast
                (pFVar10,(this->super_FxBinary).left,((this->super_FxBinary).right)->ValueType,false
                 ,true);
      (this->super_FxBinary).left = (FxExpression *)pFVar10;
      iVar6 = (*(pFVar10->super_FxExpression)._vptr_FxExpression[2])(pFVar10,ctx);
      (this->super_FxBinary).left = (FxExpression *)CONCAT44(extraout_var_02,iVar6);
      if ((FxExpression *)CONCAT44(extraout_var_02,iVar6) == (FxExpression *)0x0) goto LAB_00527da9;
      pFVar11 = (this->super_FxBinary).right;
LAB_00527ba2:
      (this->super_FxBinary).super_FxExpression.ValueType = pFVar11->ValueType;
      goto LAB_00527baa;
    }
LAB_005279bc:
    pPVar17 = pFVar11->ValueType;
    if ((pPVar20 == (PType *)TypeName || pPVar20 == (PType *)TypeString) &&
       (((pPVar17 == (PType *)TypeName || (pPVar17 == (PType *)TypeSound)) ||
        ((pPVar17 == (PType *)TypeColor ||
         ((bVar21 = DObject::IsKindOf((DObject *)pPVar17,PClassPointer::RegistrationInfo.MyClass),
          bVar21 || (pPVar17 = ((this->super_FxBinary).left)->ValueType,
                    pPVar17 == (PType *)TypeStateLabel)))))))) {
      pFVar10 = (FxTypeCast *)FMemArena::Alloc(&FxAlloc,0x38);
      FxTypeCast::FxTypeCast
                (pFVar10,(this->super_FxBinary).right,((this->super_FxBinary).left)->ValueType,false
                 ,true);
      (this->super_FxBinary).right = (FxExpression *)pFVar10;
      iVar6 = (*(pFVar10->super_FxExpression)._vptr_FxExpression[2])(pFVar10,ctx);
      (this->super_FxBinary).right = (FxExpression *)CONCAT44(extraout_var_04,iVar6);
      if ((FxExpression *)CONCAT44(extraout_var_04,iVar6) == (FxExpression *)0x0) goto LAB_00527da9;
      pFVar11 = (this->super_FxBinary).left;
      goto LAB_00527ba2;
    }
    iVar6 = (*(pPVar17->super_PTypeBase).super_DObject._vptr_DObject[8])();
    if (((char)iVar6 != '\0') &&
       (iVar6 = (*((*aVar19.pointer)->ValueType->super_PTypeBase).super_DObject._vptr_DObject[8])(),
       (char)iVar6 != '\0')) {
      FxBinary::Promote(&this->super_FxBinary,ctx,false);
      goto LAB_00527baa;
    }
    dest = (PPointer *)((this->super_FxBinary).left)->ValueType;
    source = (PPointer *)((this->super_FxBinary).right)->ValueType;
    if (source == TypeNullPtr && dest == (PPointer *)TypeStateLabel) {
      pFVar10 = (FxTypeCast *)FMemArena::Alloc(&FxAlloc,0x38);
      FxTypeCast::FxTypeCast(pFVar10,*aVar19.pointer,(PType *)TypeStateLabel,false,false);
      *(FxTypeCast **)aVar19.pointer = pFVar10;
      iVar6 = (*(pFVar10->super_FxExpression)._vptr_FxExpression[2])(pFVar10,ctx);
      pFVar11 = (FxExpression *)CONCAT44(extraout_var_03,iVar6);
      *(FxExpression **)aVar19.pointer = pFVar11;
joined_r0x00527b4a:
      if (pFVar11 == (FxExpression *)0x0) goto LAB_00527da9;
      goto LAB_00527baa;
    }
    if (dest == TypeNullPtr && (PPointer *)TypeStateLabel == source) {
      pFVar10 = (FxTypeCast *)FMemArena::Alloc(&FxAlloc,0x38);
      FxTypeCast::FxTypeCast
                (pFVar10,(this->super_FxBinary).left,(PType *)TypeStateLabel,false,false);
      (this->super_FxBinary).left = (FxExpression *)pFVar10;
      iVar6 = (*(pFVar10->super_FxExpression)._vptr_FxExpression[2])(pFVar10,ctx);
      pFVar11 = (FxExpression *)CONCAT44(extraout_var_05,iVar6);
      (this->super_FxBinary).left = pFVar11;
      goto joined_r0x00527b4a;
    }
    if ((((dest->super_PBasicType).super_PType.RegType == '\x03') &&
        ((source->super_PBasicType).super_PType.RegType == '\x03')) &&
       ((dest == source ||
        (((source == TypeNullPtr || (dest == TypeNullPtr)) ||
         (bVar21 = AreCompatiblePointerTypes((PType *)dest,(PType *)source,true), bVar21))))))
    goto LAB_00527baa;
  }
  iVar6 = (this->super_FxBinary).Operator;
  pcVar14 = "~==";
  if (iVar6 == 0x120) {
    pcVar14 = "!=";
  }
  pcVar13 = "==";
  if (iVar6 != 0x11f) {
    pcVar13 = pcVar14;
  }
  FScriptPosition::Message
            (&(this->super_FxBinary).super_FxExpression.ScriptPosition,2,
             "Incompatible operands for %s comparison",pcVar13);
LAB_00527da9:
  (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxCompareEq::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();

	RESOLVE(left, ctx);
	RESOLVE(right, ctx);
	if (!left || !right)
	{
		delete this;
		return nullptr;
	}

	if (left->ValueType != right->ValueType)	// identical types are always comparable, if they can be placed in a register, so we can save most checks if this is the case.
	{
		// Special cases: Compare strings and names with names, sounds, colors, state labels and class types.
		// These are all types a string can be implicitly cast into, so for convenience, so they should when doing a comparison.
		if ((left->ValueType == TypeString || left->ValueType == TypeName) &&
			(right->ValueType == TypeName || right->ValueType == TypeSound || right->ValueType == TypeColor || right->ValueType->IsKindOf(RUNTIME_CLASS(PClassPointer)) || right->ValueType == TypeStateLabel))
		{
			left = new FxTypeCast(left, right->ValueType, false, true);
			left = left->Resolve(ctx);
			ABORT(left);
			ValueType = right->ValueType;
		}
		else if ((right->ValueType == TypeString || right->ValueType == TypeName) &&
			(left->ValueType == TypeName || left->ValueType == TypeSound || left->ValueType == TypeColor || left->ValueType->IsKindOf(RUNTIME_CLASS(PClassPointer)) || left->ValueType == TypeStateLabel))
		{
			right = new FxTypeCast(right, left->ValueType, false, true);
			right = right->Resolve(ctx);
			ABORT(right);
			ValueType = left->ValueType;
		}
		else if (left->IsNumeric() && right->IsNumeric())
		{
			Promote(ctx);
		}
		// allows comparing state labels with null pointers.
		else if (left->ValueType == TypeStateLabel && right->ValueType == TypeNullPtr)
		{
			right = new FxTypeCast(right, TypeStateLabel, false);
			SAFE_RESOLVE(right, ctx);
		}
		else if (right->ValueType == TypeStateLabel && left->ValueType == TypeNullPtr)
		{
			left = new FxTypeCast(left, TypeStateLabel, false);
			SAFE_RESOLVE(left, ctx);
		}
		else if (left->ValueType->GetRegType() == REGT_POINTER && right->ValueType->GetRegType() == REGT_POINTER)
		{
			if (left->ValueType != right->ValueType && right->ValueType != TypeNullPtr && left->ValueType != TypeNullPtr &&
				!AreCompatiblePointerTypes(left->ValueType, right->ValueType, true))
			{
				goto error;
			}
		}
		else
		{
			goto error;
		}
	}
	else if (left->ValueType->GetRegType() == REGT_NIL)
	{
		goto error;
	}
	else
	{
		ValueType = left->ValueType;
	}

	if (Operator == TK_ApproxEq && ValueType->GetRegType() != REGT_FLOAT && ValueType->GetRegType() != REGT_STRING)
	{
		// Only floats, vectors and strings have handling for '~==', for all other types this is an error.
		goto error;
	}

	if (left->isConstant() && right->isConstant())
	{
		int v;

		if (ValueType == TypeString)
		{
			FString v1 = static_cast<FxConstant *>(left)->GetValue().GetString();
			FString v2 = static_cast<FxConstant *>(right)->GetValue().GetString();
			if (Operator == TK_ApproxEq) v = !v1.CompareNoCase(v2);
			else
			{
				v = !!v1.Compare(v2);
				if (Operator == TK_Eq) v = !v;
			}
		}
		else if (ValueType->GetRegType() == REGT_FLOAT)
		{
			double v1 = static_cast<FxConstant *>(left)->GetValue().GetFloat();
			double v2 = static_cast<FxConstant *>(right)->GetValue().GetFloat();
			v = Operator == TK_Eq? v1 == v2 : Operator == TK_Neq? v1 != v2 : fabs(v1-v2) < VM_EPSILON;
		}
		else
		{
			int v1 = static_cast<FxConstant *>(left)->GetValue().GetInt();
			int v2 = static_cast<FxConstant *>(right)->GetValue().GetInt();
			v = Operator == TK_Eq? v1 == v2 : v1 != v2;
		}
		FxExpression *e = new FxConstant(v, ScriptPosition);
		delete this;
		return e;
	}
	else
	{
		// also simplify comparisons against zero. For these a bool cast/unary not on the other value will do just as well and create better code.
		if (Operator != TK_ApproxEq)
		{
			if (left->isConstant())
			{
				bool leftisnull;
				switch (left->ValueType->GetRegType())
				{
				case REGT_INT:
					leftisnull = static_cast<FxConstant *>(left)->GetValue().GetInt() == 0;
					break;

				case REGT_FLOAT:
					assert(left->ValueType->GetRegCount() == 1);	// vectors should not be able to get here.
					leftisnull = static_cast<FxConstant *>(left)->GetValue().GetFloat() == 0;
					break;

				case REGT_POINTER:
					leftisnull = static_cast<FxConstant *>(left)->GetValue().GetPointer() == nullptr;
					break;

				default:
					leftisnull = false;
				}
				if (leftisnull)
				{
					FxExpression *x;
					if (Operator == TK_Eq) x = new FxUnaryNotBoolean(right);
					else x = new FxBoolCast(right);
					right = nullptr;
					delete this;
					return x->Resolve(ctx);
				}

			}
			if (right->isConstant())
			{
				bool rightisnull;
				switch (right->ValueType->GetRegType())
				{
				case REGT_INT:
					rightisnull = static_cast<FxConstant *>(right)->GetValue().GetInt() == 0;
					break;

				case REGT_FLOAT:
					assert(right->ValueType->GetRegCount() == 1);	// vectors should not be able to get here.
					rightisnull = static_cast<FxConstant *>(right)->GetValue().GetFloat() == 0;
					break;

				case REGT_POINTER:
					rightisnull = static_cast<FxConstant *>(right)->GetValue().GetPointer() == nullptr;
					break;

				default:
					rightisnull = false;
				}
				if (rightisnull)
				{
					FxExpression *x;
					if (Operator == TK_Eq) x = new FxUnaryNotBoolean(left);
					else x = new FxBoolCast(left);
					left = nullptr;
					delete this;
					return x->Resolve(ctx);
				}
			}
		}
	}
	ValueType = TypeBool;
	return this;

error:
	ScriptPosition.Message(MSG_ERROR, "Incompatible operands for %s comparison", Operator == TK_Eq ? "==" : Operator == TK_Neq ? "!=" : "~==");
	delete this;
	return nullptr;
}